

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseExtensions<proto2_unittest::TestAllTypes>::ParseExtensions
          (ParseExtensions<proto2_unittest::TestAllTypes> *this)

{
  ParseExtensions<proto2_unittest::TestAllTypes> *this_local;
  
  WireFormatTest<proto2_unittest::TestAllTypes>::WireFormatTest
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>);
  (this->super_WireFormatTest<proto2_unittest::TestAllTypes>).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseExtensions_029f5c90;
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseExtensions) {
  typename TestFixture::TestAllExtensions source, dest;
  std::string data;

  // Serialize using the generated code.
  TestUtil::SetAllExtensions(&source);
  source.SerializeToString(&data);

  // Parse using WireFormat.
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &dest);

  // Check.
  TestUtil::ExpectAllExtensionsSet(dest);
}